

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmXe2_LPGCachePolicy.cpp
# Opt level: O0

void __thiscall GmmLib::GmmXe2_LPGCachePolicy::SetUpMOCSTable(GmmXe2_LPGCachePolicy *this)

{
  GMM_CACHE_POLICY_TBL_ELEMENT *pGVar1;
  uint local_1c;
  uint32_t j;
  GMM_CACHE_POLICY_TBL_ELEMENT *pCachePolicyTlbElement;
  GmmXe2_LPGCachePolicy *this_local;
  
  pGVar1 = Context::GetCachePolicyTlbElement
                     (*(Context **)
                       ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                               super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
                               super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                               super_GmmCachePolicyCommon + 8));
  for (local_1c = 0; local_1c < 0x10; local_1c = local_1c + 1) {
    pGVar1[local_1c].L3.UshortValue = pGVar1[local_1c].L3.UshortValue & 0xfff3 | 0xc;
    pGVar1[local_1c].L3.UshortValue = pGVar1[local_1c].L3.UshortValue & 0x1ff;
    pGVar1[local_1c].L3.UshortValue = pGVar1[local_1c].L3.UshortValue & 0xffcf | 0x30;
    pGVar1[local_1c].L3.UshortValue = pGVar1[local_1c].L3.UshortValue & 0xff3f;
    pGVar1[local_1c].L3.UshortValue = pGVar1[local_1c].L3.UshortValue & 0xfeff;
  }
  (pGVar1->L3).UshortValue = (pGVar1->L3).UshortValue & 0xfff3 | 0xc;
  (pGVar1->L3).UshortValue = (pGVar1->L3).UshortValue & 0x1ff;
  (pGVar1->L3).UshortValue = (pGVar1->L3).UshortValue & 0xffcf;
  (pGVar1->L3).UshortValue = (pGVar1->L3).UshortValue & 0xff3f;
  (pGVar1->L3).UshortValue = (pGVar1->L3).UshortValue & 0xfeff;
  pGVar1[1].L3.UshortValue = pGVar1[1].L3.UshortValue & 0xfff3 | 0xc;
  pGVar1[1].L3.UshortValue = pGVar1[1].L3.UshortValue & 0x1ff;
  pGVar1[1].L3.UshortValue = pGVar1[1].L3.UshortValue & 0xffcf;
  pGVar1[1].L3.UshortValue = pGVar1[1].L3.UshortValue & 0xff3f;
  pGVar1[1].L3.UshortValue = pGVar1[1].L3.UshortValue & 0xfeff | 0x100;
  pGVar1[2].L3.UshortValue = pGVar1[2].L3.UshortValue & 0xfff3;
  pGVar1[2].L3.UshortValue = pGVar1[2].L3.UshortValue & 0x1ff;
  pGVar1[2].L3.UshortValue = pGVar1[2].L3.UshortValue & 0xffcf | 0x30;
  pGVar1[2].L3.UshortValue = pGVar1[2].L3.UshortValue & 0xff3f;
  pGVar1[2].L3.UshortValue = pGVar1[2].L3.UshortValue & 0xfeff | 0x100;
  pGVar1[3].L3.UshortValue = pGVar1[3].L3.UshortValue & 0xfff3 | 0xc;
  pGVar1[3].L3.UshortValue = pGVar1[3].L3.UshortValue & 0x1ff;
  pGVar1[3].L3.UshortValue = pGVar1[3].L3.UshortValue & 0xffcf | 0x30;
  pGVar1[3].L3.UshortValue = pGVar1[3].L3.UshortValue & 0xff3f;
  pGVar1[3].L3.UshortValue = pGVar1[3].L3.UshortValue & 0xfeff | 0x100;
  pGVar1[4].L3.UshortValue = pGVar1[4].L3.UshortValue & 0xfff3;
  pGVar1[4].L3.UshortValue = pGVar1[4].L3.UshortValue & 0x1ff;
  pGVar1[4].L3.UshortValue = pGVar1[4].L3.UshortValue & 0xffcf;
  pGVar1[4].L3.UshortValue = pGVar1[4].L3.UshortValue & 0xff3f;
  pGVar1[4].L3.UshortValue = pGVar1[4].L3.UshortValue & 0xfeff | 0x100;
  (this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.super_GmmGen11CachePolicy.
  super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.CurrentMaxMocsIndex = 4;
  (this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.super_GmmGen11CachePolicy.
  super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.CurrentMaxL1HdcMocsIndex = 0;
  (this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.super_GmmGen11CachePolicy.
  CurrentMaxSpecialMocsIndex = 0;
  return;
}

Assistant:

void GmmLib::GmmXe2_LPGCachePolicy::SetUpMOCSTable()
{
    GMM_CACHE_POLICY_TBL_ELEMENT *pCachePolicyTlbElement = &(pGmmLibContext->GetCachePolicyTlbElement()[0]);

#define L4_WB (0x0)
#define L4_WT (0x1)
#define L4_UC (0x3)

#define L3_WB (0x0)
#define L3_XD (pGmmLibContext->GetSkuTable().FtrL3TransientDataFlush ? 0x1 : 0x0)
#define L3_UC (0x3)

#define GMM_DEFINE_MOCS(indx, L4Caching, L3Caching, L3ClassOfService, ignorePAT) \
    {                                                                            \
        pCachePolicyTlbElement[indx].L3.PhysicalL3.L4CC      = L4Caching;        \
        pCachePolicyTlbElement[indx].L3.PhysicalL3.Reserved0 = 0;                \
        pCachePolicyTlbElement[indx].L3.PhysicalL3.L3CC      = L3Caching;        \
        pCachePolicyTlbElement[indx].L3.PhysicalL3.L3CLOS    = L3ClassOfService; \
        pCachePolicyTlbElement[indx].L3.PhysicalL3.igPAT     = ignorePAT;        \
    }

    // clang-format off
    // Default MOCS Table
    for(uint32_t j = 0; j < GMM_XE2_NUM_MOCS_ENTRIES; j++)
    {   //               Index            CachingPolicy   L3Caching      L3ClassOfService    ignorePAT
        GMM_DEFINE_MOCS( j,               L4_UC,          L3_UC,             0          ,     0  )
    }

    //             Index    L4 CachingPolicy   L3 CachingPolicy   L3 CLOS   ignorePAT
    GMM_DEFINE_MOCS( 0      , L4_UC              , L3_WB           , 0     , 0)   // Defer to PAT
    GMM_DEFINE_MOCS( 1      , L4_UC              , L3_WB           , 0     , 1)   // L3
    GMM_DEFINE_MOCS( 2      , L4_WB              , L3_UC           , 0     , 1)   // L4
    GMM_DEFINE_MOCS( 3      , L4_UC              , L3_UC           , 0     , 1)   // UC
    GMM_DEFINE_MOCS( 4      , L4_WB              , L3_WB           , 0     , 1)   // L3+L4

    CurrentMaxMocsIndex = 4;
    CurrentMaxL1HdcMocsIndex   = 0;
    CurrentMaxSpecialMocsIndex = 0;
    // clang-format on

#undef GMM_DEFINE_MOCS
#undef L4_WB
#undef L4_WT
#undef L4_UC

#undef L3_WB
#undef L3_XD
#undef L3_UC
}